

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O1

void __thiscall
llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::~BumpPtrAllocatorImpl
          (BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *this)

{
  void *pvVar1;
  undefined1 *puVar2;
  long lVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(this->Slabs).super_SmallVectorImpl<void_*>.
                 super_SmallVectorTemplateBase<void_*,_true>.
                 super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.Size;
  if (uVar4 != 0) {
    pvVar1 = (this->Slabs).super_SmallVectorImpl<void_*>.super_SmallVectorTemplateBase<void_*,_true>
             .super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.BeginX;
    lVar3 = 0;
    do {
      free(*(void **)((long)pvVar1 + lVar3));
      lVar3 = lVar3 + 8;
    } while (uVar4 << 3 != lVar3);
  }
  uVar4 = (ulong)(this->CustomSizedSlabs).super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>.
                 super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_true>.
                 super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.
                 super_SmallVectorBase.Size;
  if (uVar4 != 0) {
    pvVar1 = (this->CustomSizedSlabs).super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>.
             super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_true>.
             super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.
             super_SmallVectorBase.BeginX;
    lVar3 = 0;
    do {
      free(*(void **)((long)pvVar1 + lVar3));
      lVar3 = lVar3 + 0x10;
    } while (uVar4 << 4 != lVar3);
  }
  puVar2 = (undefined1 *)
           (this->CustomSizedSlabs).super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>.
           super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_true>.
           super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.
           super_SmallVectorBase.BeginX;
  if ((size_t *)puVar2 != &this->BytesAllocated) {
    free(puVar2);
  }
  puVar2 = (undefined1 *)
           (this->Slabs).super_SmallVectorImpl<void_*>.super_SmallVectorTemplateBase<void_*,_true>.
           super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.BeginX;
  if ((SmallVectorStorage<void_*,_4U> *)puVar2 !=
      &(this->Slabs).super_SmallVectorStorage<void_*,_4U>) {
    free(puVar2);
    return;
  }
  return;
}

Assistant:

~BumpPtrAllocatorImpl() {
    DeallocateSlabs(Slabs.begin(), Slabs.end());
    DeallocateCustomSizedSlabs();
  }